

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcompleter.cpp
# Opt level: O1

QMatchData * __thiscall
QUnsortedModelEngine::filter
          (QMatchData *__return_storage_ptr__,QUnsortedModelEngine *this,QString *part,
          QModelIndex *parent,int n)

{
  char16_t *pcVar1;
  QString part_00;
  Data *pDVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  long *plVar8;
  int *piVar9;
  int iVar10;
  long in_FS_OFFSET;
  QIndexMapper rest;
  QMatchData hint;
  undefined4 in_stack_ffffffffffffff18;
  QArrayData *pQVar11;
  QIndexMapper local_c8;
  QMatchData local_98;
  QMatchData local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_68.indices.v = false;
  local_68.indices._1_7_ = 0xaaaaaaaaaaaaaa;
  local_68.indices.vector.d.d = (Data *)0x0;
  local_68.indices.vector.d.ptr._0_4_ = 0;
  local_68.indices.vector.d.ptr._4_4_ = 0;
  local_68.indices.vector.d.size._0_4_ = 0;
  local_68.indices.vector.d.size._4_4_ = 0;
  local_68.indices.f = 0;
  local_68.indices.t = -1;
  local_68.exactMatchIndex = -1;
  local_68.partial = false;
  local_68._45_3_ = 0xaaaaaa;
  local_98.indices.v = true;
  local_98.indices._1_7_ = 0xaaaaaaaaaaaaaa;
  local_98.indices.vector.d.d = (Data *)0x0;
  local_98.indices.vector.d.ptr = (int *)0x0;
  local_98.indices.vector.d.size = 0;
  local_98.indices.f = -1;
  local_98.indices.t = -1;
  local_98.exactMatchIndex = -1;
  local_98.partial = true;
  local_98._45_3_ = 0xaaaaaa;
  plVar8 = (long *)QAbstractProxyModel::sourceModel();
  bVar5 = QCompletionEngine::lookupCache(&this->super_QCompletionEngine,part,parent,&local_98);
  if (bVar5) {
LAB_006594ab:
    if (local_98.partial == true) {
      if ((n != -1) || (local_98.exactMatchIndex != -1)) {
        if (local_98.indices.v == true) {
          iVar7 = (int)local_98.indices.vector.d.size;
        }
        else {
          iVar7 = (local_98.indices.t - local_98.indices.f) + 1;
        }
        if (n <= iVar7) goto LAB_006596b3;
      }
      iVar7 = (**(code **)(*plVar8 + 0x78))(plVar8,parent);
      piVar9 = (int *)(CONCAT44(local_68.indices.vector.d.ptr._4_4_,
                                local_68.indices.vector.d.ptr._0_4_) + -4 +
                      CONCAT44(local_68.indices.vector.d.size._4_4_,
                               (undefined4)local_68.indices.vector.d.size) * 4);
      if (local_68.indices.v == false) {
        piVar9 = &local_68.indices.t;
      }
      local_c8.f = *piVar9 + 1;
      local_c8.v = false;
      local_c8._1_7_ = 0xaaaaaaaaaaaaaa;
      local_c8.vector.d.d = (Data *)0x0;
      local_c8.vector.d.ptr._0_4_ = 0;
      local_c8.vector.d.ptr._4_4_ = 0;
      local_c8.vector.d.size._0_4_ = 0;
      local_c8.vector.d.size._4_4_ = 0;
      if (n == -1) {
        iVar10 = -1;
      }
      else {
        if (local_98.indices.v == true) {
          iVar10 = (int)local_98.indices.vector.d.size;
        }
        else {
          iVar10 = (local_98.indices.t - local_98.indices.f) + 1;
        }
        iVar10 = n - iVar10;
      }
      local_c8.t = iVar7 + -1;
      iVar10 = buildIndices(this,part,parent,iVar10,&local_c8,&local_98);
      local_98.partial = iVar7 + -1 != iVar10;
      if (&(local_c8.vector.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_c8.vector.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_c8.vector.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
             -1;
        UNLOCK();
        if (((local_c8.vector.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
            0) {
          QArrayData::deallocate(&(local_c8.vector.d.d)->super_QArrayData,4,0x10);
        }
      }
    }
  }
  else {
    bVar6 = QCompletionEngine::matchHint(&this->super_QCompletionEngine,part,parent,&local_68);
    if (bVar6) {
      if (local_68.indices.v == true) {
        bVar6 = CONCAT44(local_68.indices.vector.d.size._4_4_,
                         (undefined4)local_68.indices.vector.d.size) == 0;
      }
      else {
        bVar6 = local_68.indices.t < local_68.indices.f;
      }
      if (bVar6) {
        (__return_storage_ptr__->indices).v = false;
        (__return_storage_ptr__->indices).vector.d.d = (Data *)0x0;
        (__return_storage_ptr__->indices).vector.d.ptr = (int *)0x0;
        *(undefined8 *)((long)&(__return_storage_ptr__->indices).vector.d.ptr + 4) = 0;
        *(undefined8 *)((long)&(__return_storage_ptr__->indices).vector.d.size + 4) = 0;
        *(undefined8 *)&(__return_storage_ptr__->indices).t = 0xffffffffffffffff;
        __return_storage_ptr__->partial = false;
        goto LAB_0065974e;
      }
    }
    if (bVar5) goto LAB_006594ab;
    if (local_68.indices.v == true) {
      bVar6 = CONCAT44(local_68.indices.vector.d.size._4_4_,
                       (undefined4)local_68.indices.vector.d.size) == 0;
    }
    else {
      bVar6 = local_68.indices.t < local_68.indices.f;
    }
    if (!bVar6) {
      if (!bVar5) {
        buildIndices(this,part,parent,0x7fffffff,&local_68.indices,&local_98);
        local_98.partial = local_68.partial;
      }
      goto LAB_006594ab;
    }
    iVar7 = (**(code **)(*plVar8 + 0x78))(plVar8,parent);
    local_c8.v = false;
    local_c8._1_7_ = 0xaaaaaaaaaaaaaa;
    local_c8.vector.d.d = (Data *)0x0;
    local_c8.vector.d.ptr._0_4_ = 0;
    local_c8.vector.d.ptr._4_4_ = 0;
    local_c8.vector.d.size._0_4_ = 0;
    local_c8.vector.d.size._4_4_ = 0;
    local_c8.f = 0;
    local_c8.t = iVar7 + -1;
    iVar10 = buildIndices(this,part,parent,n,&local_c8,&local_98);
    local_98.partial = iVar10 != iVar7 + -1;
  }
LAB_006596b3:
  pQVar11 = &((part->d).d)->super_QArrayData;
  pcVar1 = (part->d).ptr;
  if (pQVar11 != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&pQVar11->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
         (((QArrayData *)&pQVar11->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  part_00.d.d._4_4_ = n;
  part_00.d.d._0_4_ = in_stack_ffffffffffffff18;
  part_00.d.ptr = (char16_t *)pQVar11;
  part_00.d.size = (qsizetype)pcVar1;
  QCompletionEngine::saveInCache
            (&this->super_QCompletionEngine,part_00,(QModelIndex *)&stack0xffffffffffffff20,
             (QMatchData *)parent);
  if (pQVar11 != (QArrayData *)0x0) {
    LOCK();
    (pQVar11->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar11->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar11->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar11,2,0x10);
    }
  }
  piVar9 = local_98.indices.vector.d.ptr;
  pDVar2 = local_98.indices.vector.d.d;
  (__return_storage_ptr__->indices).v = local_98.indices.v;
  local_98.indices.vector.d.d = (Data *)0x0;
  local_98.indices.vector.d.ptr = (int *)0x0;
  (__return_storage_ptr__->indices).vector.d.d = pDVar2;
  (__return_storage_ptr__->indices).vector.d.ptr = piVar9;
  uVar3 = (int)local_98.indices.vector.d.size;
  uVar4 = local_98.indices.vector.d.size._4_4_;
  local_98.indices.vector.d.size = 0;
  *(undefined4 *)&(__return_storage_ptr__->indices).vector.d.size = uVar3;
  *(undefined4 *)((long)&(__return_storage_ptr__->indices).vector.d.size + 4) = uVar4;
  (__return_storage_ptr__->indices).f = local_98.indices.f;
  (__return_storage_ptr__->indices).t = local_98.indices.t;
  __return_storage_ptr__->exactMatchIndex = local_98.exactMatchIndex;
  __return_storage_ptr__->partial = local_98.partial;
LAB_0065974e:
  if (&(local_98.indices.vector.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.indices.vector.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.indices.vector.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
         _M_i + -1;
    UNLOCK();
    if (((local_98.indices.vector.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
        _M_i == 0) {
      QArrayData::deallocate(&(local_98.indices.vector.d.d)->super_QArrayData,4,0x10);
    }
  }
  if (&(local_68.indices.vector.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.indices.vector.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.indices.vector.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
         _M_i + -1;
    UNLOCK();
    if (((local_68.indices.vector.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
        _M_i == 0) {
      QArrayData::deallocate(&(local_68.indices.vector.d.d)->super_QArrayData,4,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QMatchData QUnsortedModelEngine::filter(const QString& part, const QModelIndex& parent, int n)
{
    QMatchData hint;

    QList<int> v;
    QIndexMapper im(v);
    QMatchData m(im, -1, true);

    const QAbstractItemModel *model = c->proxy->sourceModel();
    bool foundInCache = lookupCache(part, parent, &m);

    if (!foundInCache) {
        if (matchHint(part, parent, &hint) && !hint.isValid())
            return QMatchData();
    }

    if (!foundInCache && !hint.isValid()) {
        const int lastRow = model->rowCount(parent) - 1;
        QIndexMapper all(0, lastRow);
        int lastIndex = buildIndices(part, parent, n, all, &m);
        m.partial = (lastIndex != lastRow);
    } else {
        if (!foundInCache) { // build from hint as much as we can
            buildIndices(part, parent, INT_MAX, hint.indices, &m);
            m.partial = hint.partial;
        }
        if (m.partial && ((n == -1 && m.exactMatchIndex == -1) || (m.indices.count() < n))) {
            // need more and have more
            const int lastRow = model->rowCount(parent) - 1;
            QIndexMapper rest(hint.indices.last() + 1, lastRow);
            int want = n == -1 ? -1 : n - m.indices.count();
            int lastIndex = buildIndices(part, parent, want, rest, &m);
            m.partial = (lastRow != lastIndex);
        }
    }

    saveInCache(part, parent, m);
    return m;
}